

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall Js::ScriptFunction::PrepareForConversionToNonPathType(ScriptFunction *this)

{
  ScriptFunctionType *this_00;
  FunctionProxy *this_01;
  ProxyEntryPointInfo *local_18;
  ProxyEntryPointInfo *entryPointInfo;
  ScriptFunction *this_local;
  
  entryPointInfo = (ProxyEntryPointInfo *)this;
  this_00 = GetScriptFunctionType(this);
  local_18 = ScriptFunctionType::GetEntryPointInfo(this_00);
  this_01 = GetFunctionProxy(this);
  FunctionProxy::
  MapFunctionObjectTypes<Js::ScriptFunction::PrepareForConversionToNonPathType()::__0>
            (this_01,(anon_class_8_1_dd74c04a)&local_18);
  return;
}

Assistant:

void ScriptFunction::PrepareForConversionToNonPathType()
    {
        // We have a path type handler that is currently responsible for holding some number of entry point infos alive.
        // The last one will be copied on to the new dictionary type handler, but if any previous instances in the path
        // are holding different entry point infos, those need to be copied to somewhere safe.
        // The number of entry points is likely low compared to length of path, so iterate those instead.

        ProxyEntryPointInfo* entryPointInfo = this->GetScriptFunctionType()->GetEntryPointInfo();

        this->GetFunctionProxy()->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            CopyEntryPointInfoToThreadContextIfNecessary(functionType->GetEntryPointInfo(), entryPointInfo);
        });
    }